

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

bool __thiscall
FOptionMenuScreenResolutionLine::SetString
          (FOptionMenuScreenResolutionLine *this,int i,char *newtext)

{
  bool bVar1;
  char *newtext_local;
  int i_local;
  FOptionMenuScreenResolutionLine *this_local;
  
  if ((i < 0x30000) || (0x30002 < i)) {
    this_local._7_1_ = false;
  }
  else {
    FString::operator=(this->mResTexts + (i + -0x30000),newtext);
    bVar1 = FString::IsEmpty(this->mResTexts);
    if (bVar1) {
      this->mMaxValid = -1;
    }
    else {
      bVar1 = FString::IsEmpty(this->mResTexts + 1);
      if (bVar1) {
        this->mMaxValid = 0;
      }
      else {
        bVar1 = FString::IsEmpty(this->mResTexts + 2);
        if (bVar1) {
          this->mMaxValid = 1;
        }
        else {
          this->mMaxValid = 2;
        }
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SetString(int i, const char *newtext)
	{
		if (i >= SRL_INDEX && i <= SRL_INDEX+2) 
		{
			mResTexts[i-SRL_INDEX] = newtext;
			if (mResTexts[0].IsEmpty()) mMaxValid = -1;
			else if (mResTexts[1].IsEmpty()) mMaxValid = 0;
			else if (mResTexts[2].IsEmpty()) mMaxValid = 1;
			else mMaxValid = 2;
			return true;
		}
		return false;
	}